

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O1

void __thiscall
gimage::PNMImageIO::loadHeader(PNMImageIO *this,char *name,long *width,long *height,int *depth)

{
  int iVar1;
  IOException *this_00;
  long *plVar2;
  size_type *psVar3;
  float scale;
  long maxval;
  allocator local_95;
  float local_94;
  string local_90;
  long local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar1 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar1 != '\0') {
    anon_unknown_11::readPNMHeader(name,depth,&local_70,&local_94,width,height);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_68,name,&local_95);
  std::operator+(&local_48,"Can only load PNM image (",&local_68);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_90._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_90._M_dataplus._M_p == psVar3) {
    local_90.field_2._M_allocated_capacity = *psVar3;
    local_90.field_2._8_8_ = plVar2[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar3;
  }
  local_90._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  gutil::IOException::IOException(this_00,&local_90);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PNMImageIO::loadHeader(const char *name, long &width, long &height,
                            int &depth) const
{
  long  maxval;
  float scale;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  readPNMHeader(name, depth, maxval, scale, width, height);
}